

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

int __thiscall QSocks5SocketEngine::option(QSocks5SocketEngine *this,SocketOption option)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = *(long **)(*(long *)(this + 8) + 0xf8);
  iVar1 = -1;
  if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
    if (option == KeepAliveOption) {
      plVar4 = (long *)*plVar4;
      lVar2 = *plVar4;
      uVar3 = 1;
    }
    else {
      if (option != LowDelayOption) goto LAB_0023fc4f;
      plVar4 = (long *)*plVar4;
      lVar2 = *plVar4;
      uVar3 = 0;
    }
    (**(code **)(lVar2 + 0x128))(&QStack_38,plVar4,uVar3);
    iVar1 = QVariant::toInt((bool *)&QStack_38);
    QVariant::~QVariant(&QStack_38);
  }
LAB_0023fc4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QSocks5SocketEngine::option(SocketOption option) const
{
    Q_D(const QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::LowDelayOption).toInt();
        if (option == QAbstractSocketEngine::KeepAliveOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::KeepAliveOption).toInt();
    }
    return -1;
}